

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_color nk_rgb_hex(char *rgb)

{
  byte bVar1;
  uint uVar2;
  int len;
  uint uVar3;
  long lVar4;
  int len_1;
  int iVar5;
  char *c;
  int iVar6;
  bool bVar7;
  
  bVar7 = *rgb == '#';
  lVar4 = 0;
  uVar2 = 0;
  do {
    bVar1 = rgb[lVar4 + (ulong)bVar7];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar5 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar5 = bVar1 - 0x37;
    }
    else {
      iVar5 = bVar1 - 0x30;
    }
    uVar2 = uVar2 * 0x10 + iVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  lVar4 = 0;
  uVar3 = 0;
  do {
    bVar1 = rgb[lVar4 + (ulong)bVar7 + 2];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar5 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar5 = bVar1 - 0x37;
    }
    else {
      iVar5 = bVar1 - 0x30;
    }
    uVar3 = uVar3 * 0x10 + iVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  lVar4 = 0;
  iVar5 = 0;
  do {
    bVar1 = rgb[lVar4 + (ulong)bVar7 + 4];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar6 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar6 = bVar1 - 0x37;
    }
    else {
      iVar6 = bVar1 - 0x30;
    }
    iVar5 = iVar5 * 0x10 + iVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  return (nk_color)(uVar2 & 0xff | (uVar3 & 0xff) << 8 | iVar5 * 0x10000 | 0xff000000);
}

Assistant:

NK_API struct nk_color
nk_rgb_hex(const char *rgb)
{
    struct nk_color col;
    const char *c = rgb;
    if (*c == '#') c++;
    col.r = (nk_byte)nk_parse_hex(c, 2);
    col.g = (nk_byte)nk_parse_hex(c+2, 2);
    col.b = (nk_byte)nk_parse_hex(c+4, 2);
    col.a = 255;
    return col;
}